

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# metaf.hpp
# Opt level: O1

optional<metaf::WindGroup> *
metaf::WindGroup::parse
          (optional<metaf::WindGroup> *__return_storage_ptr__,string *group,ReportPart reportPart,
          ReportMetadata *reportMetadata)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __s;
  Direction DVar2;
  Direction DVar3;
  void *pvVar4;
  long lVar5;
  bool bVar6;
  _Optional_payload<metaf::WindGroup,_true,_true,_true> *p_Var7;
  Unit unit;
  bool bVar8;
  int iVar9;
  ulong uVar10;
  int iVar11;
  Type TVar12;
  long lVar13;
  long *plVar14;
  _Storage<metaf::WindGroup,_true> *p_Var15;
  optional<metaf::WindGroup> *poVar16;
  ulong uVar17;
  ulong uVar18;
  bool bVar19;
  bool bVar20;
  byte bVar21;
  undefined4 uVar22;
  undefined4 uVar23;
  optional<metaf::Direction> oVar24;
  optional<metaf::Speed> oVar25;
  optional<metaf::WindGroup> result;
  optional<metaf::Distance> wsHeight;
  undefined1 local_154;
  string_type local_150;
  undefined8 local_130;
  string_type local_128;
  ulong local_108;
  uint local_100;
  undefined4 uStack_fc;
  undefined3 uStack_f8;
  undefined4 uStack_f5;
  uint uStack_f1;
  Type TStack_ed;
  _Storage<metaf::WindGroup,_true> local_e8;
  char local_80;
  optional<metaf::Distance> local_70;
  _Storage<metaf::Direction,_true> local_58;
  string_type local_50;
  
  bVar21 = 0;
  if (reportPart == RMK) {
    bVar21 = 0;
    iVar9 = std::__cxx11::string::compare((char *)group);
    if (iVar9 == 0) {
      *(undefined8 *)
       &(__return_storage_ptr__->super__Optional_base<metaf::WindGroup,_true,_true>)._M_payload.
        super__Optional_payload_base<metaf::WindGroup>._M_payload = 6;
LAB_001ade2e:
      (__return_storage_ptr__->super__Optional_base<metaf::WindGroup,_true,_true>)._M_payload.
      super__Optional_payload_base<metaf::WindGroup>._M_payload._M_value.windDir.dirType =
           NOT_REPORTED;
      *(undefined1 *)
       ((long)&(__return_storage_ptr__->super__Optional_base<metaf::WindGroup,_true,_true>).
               _M_payload.super__Optional_payload_base<metaf::WindGroup>._M_payload + 0x10) = 0;
      (__return_storage_ptr__->super__Optional_base<metaf::WindGroup,_true,_true>)._M_payload.
      super__Optional_payload_base<metaf::WindGroup>._M_payload._M_value.wSpeed.speedUnit = KNOTS;
      *(undefined1 *)
       ((long)&(__return_storage_ptr__->super__Optional_base<metaf::WindGroup,_true,_true>).
               _M_payload.super__Optional_payload_base<metaf::WindGroup>._M_payload + 0x1c) = 0;
      *(undefined8 *)
       &(__return_storage_ptr__->super__Optional_base<metaf::WindGroup,_true,_true>)._M_payload.
        super__Optional_payload_base<metaf::WindGroup>._M_payload._M_value.gSpeed.speedUnit = 0;
      *(undefined1 *)
       ((long)&(__return_storage_ptr__->super__Optional_base<metaf::WindGroup,_true,_true>).
               _M_payload.super__Optional_payload_base<metaf::WindGroup>._M_payload + 0x2c) = 0;
      *(ulong *)((long)&(__return_storage_ptr__->super__Optional_base<metaf::WindGroup,_true,_true>)
                        ._M_payload.super__Optional_payload_base<metaf::WindGroup>._M_payload + 0x2d
                ) = (ulong)(uint3)local_e8._M_value.windType._0_3_;
      *(undefined8 *)
       ((long)&(__return_storage_ptr__->super__Optional_base<metaf::WindGroup,_true,_true>).
               _M_payload.super__Optional_payload_base<metaf::WindGroup>._M_payload._M_value.
               vsecBegin.dirDegrees + 1) = 0;
      p_Var7 = &(__return_storage_ptr__->super__Optional_base<metaf::WindGroup,_true,_true>).
                _M_payload;
      *(uint *)((long)&(p_Var7->super__Optional_payload_base<metaf::WindGroup>)._M_payload + 0x3c) =
           0;
      *(Type *)((long)&(p_Var7->super__Optional_payload_base<metaf::WindGroup>)._M_payload + 0x40) =
           NOT_REPORTED;
      *(undefined1 *)
       ((long)&(__return_storage_ptr__->super__Optional_base<metaf::WindGroup,_true,_true>).
               _M_payload.super__Optional_payload_base<metaf::WindGroup>._M_payload + 0x54) = 0;
      *(undefined1 *)
       ((long)&(__return_storage_ptr__->super__Optional_base<metaf::WindGroup,_true,_true>).
               _M_payload.super__Optional_payload_base<metaf::WindGroup>._M_payload + 0x60) = 0;
      (__return_storage_ptr__->super__Optional_base<metaf::WindGroup,_true,_true>)._M_payload.
      super__Optional_payload_base<metaf::WindGroup>._M_payload._M_value.incompleteText = NONE;
      goto LAB_001adf56;
    }
    iVar9 = std::__cxx11::string::compare((char *)group);
    if (iVar9 == 0) {
      *(undefined8 *)
       &(__return_storage_ptr__->super__Optional_base<metaf::WindGroup,_true,_true>)._M_payload.
        super__Optional_payload_base<metaf::WindGroup>._M_payload = 8;
      (__return_storage_ptr__->super__Optional_base<metaf::WindGroup,_true,_true>)._M_payload.
      super__Optional_payload_base<metaf::WindGroup>._M_payload._M_value.windDir.dirType =
           NOT_REPORTED;
      *(undefined1 *)
       ((long)&(__return_storage_ptr__->super__Optional_base<metaf::WindGroup,_true,_true>).
               _M_payload.super__Optional_payload_base<metaf::WindGroup>._M_payload + 0x10) = 0;
      (__return_storage_ptr__->super__Optional_base<metaf::WindGroup,_true,_true>)._M_payload.
      super__Optional_payload_base<metaf::WindGroup>._M_payload._M_value.wSpeed.speedUnit = KNOTS;
      *(undefined1 *)
       ((long)&(__return_storage_ptr__->super__Optional_base<metaf::WindGroup,_true,_true>).
               _M_payload.super__Optional_payload_base<metaf::WindGroup>._M_payload + 0x1c) = 0;
      *(undefined8 *)
       &(__return_storage_ptr__->super__Optional_base<metaf::WindGroup,_true,_true>)._M_payload.
        super__Optional_payload_base<metaf::WindGroup>._M_payload._M_value.gSpeed.speedUnit = 0;
      *(undefined1 *)
       ((long)&(__return_storage_ptr__->super__Optional_base<metaf::WindGroup,_true,_true>).
               _M_payload.super__Optional_payload_base<metaf::WindGroup>._M_payload + 0x2c) = 0;
      *(ulong *)((long)&(__return_storage_ptr__->super__Optional_base<metaf::WindGroup,_true,_true>)
                        ._M_payload.super__Optional_payload_base<metaf::WindGroup>._M_payload + 0x2d
                ) = (ulong)(uint3)local_e8._M_value.windType._0_3_;
      *(undefined8 *)
       ((long)&(__return_storage_ptr__->super__Optional_base<metaf::WindGroup,_true,_true>).
               _M_payload.super__Optional_payload_base<metaf::WindGroup>._M_payload._M_value.
               vsecBegin.dirDegrees + 1) = 0;
      p_Var7 = &(__return_storage_ptr__->super__Optional_base<metaf::WindGroup,_true,_true>).
                _M_payload;
      *(uint *)((long)&(p_Var7->super__Optional_payload_base<metaf::WindGroup>)._M_payload + 0x3c) =
           0;
      *(Type *)((long)&(p_Var7->super__Optional_payload_base<metaf::WindGroup>)._M_payload + 0x40) =
           NOT_REPORTED;
      *(undefined1 *)
       ((long)&(__return_storage_ptr__->super__Optional_base<metaf::WindGroup,_true,_true>).
               _M_payload.super__Optional_payload_base<metaf::WindGroup>._M_payload + 0x54) = 0;
      *(undefined1 *)
       ((long)&(__return_storage_ptr__->super__Optional_base<metaf::WindGroup,_true,_true>).
               _M_payload.super__Optional_payload_base<metaf::WindGroup>._M_payload + 0x60) = 0;
      (__return_storage_ptr__->super__Optional_base<metaf::WindGroup,_true,_true>)._M_payload.
      super__Optional_payload_base<metaf::WindGroup>._M_payload._M_value.incompleteText = PK;
      goto LAB_001adf56;
    }
    iVar9 = std::__cxx11::string::compare((char *)group);
    if (iVar9 == 0) {
      *(undefined8 *)
       &(__return_storage_ptr__->super__Optional_base<metaf::WindGroup,_true,_true>)._M_payload.
        super__Optional_payload_base<metaf::WindGroup>._M_payload = 10;
      (__return_storage_ptr__->super__Optional_base<metaf::WindGroup,_true,_true>)._M_payload.
      super__Optional_payload_base<metaf::WindGroup>._M_payload._M_value.windDir.dirType =
           NOT_REPORTED;
      *(undefined1 *)
       ((long)&(__return_storage_ptr__->super__Optional_base<metaf::WindGroup,_true,_true>).
               _M_payload.super__Optional_payload_base<metaf::WindGroup>._M_payload + 0x10) = 0;
      (__return_storage_ptr__->super__Optional_base<metaf::WindGroup,_true,_true>)._M_payload.
      super__Optional_payload_base<metaf::WindGroup>._M_payload._M_value.wSpeed.speedUnit = KNOTS;
      *(undefined1 *)
       ((long)&(__return_storage_ptr__->super__Optional_base<metaf::WindGroup,_true,_true>).
               _M_payload.super__Optional_payload_base<metaf::WindGroup>._M_payload + 0x1c) = 0;
      *(undefined8 *)
       &(__return_storage_ptr__->super__Optional_base<metaf::WindGroup,_true,_true>)._M_payload.
        super__Optional_payload_base<metaf::WindGroup>._M_payload._M_value.gSpeed.speedUnit = 0;
      *(undefined1 *)
       ((long)&(__return_storage_ptr__->super__Optional_base<metaf::WindGroup,_true,_true>).
               _M_payload.super__Optional_payload_base<metaf::WindGroup>._M_payload + 0x2c) = 0;
      *(ulong *)((long)&(__return_storage_ptr__->super__Optional_base<metaf::WindGroup,_true,_true>)
                        ._M_payload.super__Optional_payload_base<metaf::WindGroup>._M_payload + 0x2d
                ) = (ulong)(uint3)local_e8._M_value.windType._0_3_;
      *(undefined8 *)
       ((long)&(__return_storage_ptr__->super__Optional_base<metaf::WindGroup,_true,_true>).
               _M_payload.super__Optional_payload_base<metaf::WindGroup>._M_payload._M_value.
               vsecBegin.dirDegrees + 1) = 0;
      p_Var7 = &(__return_storage_ptr__->super__Optional_base<metaf::WindGroup,_true,_true>).
                _M_payload;
      *(uint *)((long)&(p_Var7->super__Optional_payload_base<metaf::WindGroup>)._M_payload + 0x3c) =
           0;
      *(Type *)((long)&(p_Var7->super__Optional_payload_base<metaf::WindGroup>)._M_payload + 0x40) =
           NOT_REPORTED;
      *(undefined1 *)
       ((long)&(__return_storage_ptr__->super__Optional_base<metaf::WindGroup,_true,_true>).
               _M_payload.super__Optional_payload_base<metaf::WindGroup>._M_payload + 0x54) = 0;
      *(undefined1 *)
       ((long)&(__return_storage_ptr__->super__Optional_base<metaf::WindGroup,_true,_true>).
               _M_payload.super__Optional_payload_base<metaf::WindGroup>._M_payload + 0x60) = 0;
      (__return_storage_ptr__->super__Optional_base<metaf::WindGroup,_true,_true>)._M_payload.
      super__Optional_payload_base<metaf::WindGroup>._M_payload._M_value.incompleteText = WND;
      goto LAB_001adf56;
    }
  }
  else if (reportPart == TAF) {
    bVar21 = 0;
    iVar9 = std::__cxx11::string::compare((char *)group);
    if (iVar9 == 0) {
      *(undefined8 *)
       &(__return_storage_ptr__->super__Optional_base<metaf::WindGroup,_true,_true>)._M_payload.
        super__Optional_payload_base<metaf::WindGroup>._M_payload = 9;
      goto LAB_001ade2e;
    }
  }
  else if ((reportPart == METAR) &&
          (iVar9 = std::__cxx11::string::compare((char *)group), iVar9 == 0)) {
    *(undefined8 *)
     &(__return_storage_ptr__->super__Optional_base<metaf::WindGroup,_true,_true>)._M_payload.
      super__Optional_payload_base<metaf::WindGroup>._M_payload = 5;
    (__return_storage_ptr__->super__Optional_base<metaf::WindGroup,_true,_true>)._M_payload.
    super__Optional_payload_base<metaf::WindGroup>._M_payload._M_value.windDir.dirType =
         NOT_REPORTED;
    *(undefined1 *)
     ((long)&(__return_storage_ptr__->super__Optional_base<metaf::WindGroup,_true,_true>)._M_payload
             .super__Optional_payload_base<metaf::WindGroup>._M_payload + 0x10) = 0;
    (__return_storage_ptr__->super__Optional_base<metaf::WindGroup,_true,_true>)._M_payload.
    super__Optional_payload_base<metaf::WindGroup>._M_payload._M_value.wSpeed.speedUnit = KNOTS;
    *(undefined1 *)
     ((long)&(__return_storage_ptr__->super__Optional_base<metaf::WindGroup,_true,_true>)._M_payload
             .super__Optional_payload_base<metaf::WindGroup>._M_payload + 0x1c) = 0;
    *(undefined8 *)
     &(__return_storage_ptr__->super__Optional_base<metaf::WindGroup,_true,_true>)._M_payload.
      super__Optional_payload_base<metaf::WindGroup>._M_payload._M_value.gSpeed.speedUnit = 0;
    *(undefined1 *)
     ((long)&(__return_storage_ptr__->super__Optional_base<metaf::WindGroup,_true,_true>)._M_payload
             .super__Optional_payload_base<metaf::WindGroup>._M_payload + 0x2c) = 0;
    *(ulong *)((long)&(__return_storage_ptr__->super__Optional_base<metaf::WindGroup,_true,_true>).
                      _M_payload.super__Optional_payload_base<metaf::WindGroup>._M_payload + 0x2d) =
         (ulong)(uint3)local_e8._M_value.windType._0_3_;
    *(undefined8 *)
     ((long)&(__return_storage_ptr__->super__Optional_base<metaf::WindGroup,_true,_true>)._M_payload
             .super__Optional_payload_base<metaf::WindGroup>._M_payload._M_value.vsecBegin.
             dirDegrees + 1) = 0;
    p_Var7 = &(__return_storage_ptr__->super__Optional_base<metaf::WindGroup,_true,_true>).
              _M_payload;
    *(uint *)((long)&(p_Var7->super__Optional_payload_base<metaf::WindGroup>)._M_payload + 0x3c) = 0
    ;
    *(Type *)((long)&(p_Var7->super__Optional_payload_base<metaf::WindGroup>)._M_payload + 0x40) =
         NOT_REPORTED;
    *(undefined1 *)
     ((long)&(__return_storage_ptr__->super__Optional_base<metaf::WindGroup,_true,_true>)._M_payload
             .super__Optional_payload_base<metaf::WindGroup>._M_payload + 0x54) = 0;
    *(undefined1 *)
     ((long)&(__return_storage_ptr__->super__Optional_base<metaf::WindGroup,_true,_true>)._M_payload
             .super__Optional_payload_base<metaf::WindGroup>._M_payload + 0x60) = 0;
    (__return_storage_ptr__->super__Optional_base<metaf::WindGroup,_true,_true>)._M_payload.
    super__Optional_payload_base<metaf::WindGroup>._M_payload._M_value.incompleteText = WS;
    goto LAB_001adf56;
  }
  if (reportPart - RMK < 0xfffffffe) goto LAB_001add00;
  parseVariableSector((optional<metaf::WindGroup> *)&local_e8._M_value,group);
  if (local_80 == '\x01') {
    p_Var15 = &local_e8;
    poVar16 = __return_storage_ptr__;
    for (lVar13 = 0x1a; lVar13 != 0; lVar13 = lVar13 + -1) {
      (poVar16->super__Optional_base<metaf::WindGroup,_true,_true>)._M_payload.
      super__Optional_payload_base<metaf::WindGroup>._M_payload._M_value.windType =
           (p_Var15->_M_value).windType;
      p_Var15 = (_Storage<metaf::WindGroup,_true> *)((long)p_Var15 + ((ulong)bVar21 * -2 + 1) * 4);
      poVar16 = (optional<metaf::WindGroup> *)((long)poVar16 + (ulong)bVar21 * -8 + 4);
    }
LAB_001adf56:
    (__return_storage_ptr__->super__Optional_base<metaf::WindGroup,_true,_true>)._M_payload.
    super__Optional_payload_base<metaf::WindGroup>._M_engaged = true;
    return __return_storage_ptr__;
  }
  if ((parse(std::__cxx11::string_const&,metaf::ReportPart,metaf::ReportMetadata_const&)::
       windRgx_abi_cxx11_ == '\0') &&
     (iVar9 = __cxa_guard_acquire(&parse(std::__cxx11::string_const&,metaf::ReportPart,metaf::ReportMetadata_const&)
                                   ::windRgx_abi_cxx11_), iVar9 != 0)) {
    std::__cxx11::basic_regex<char,_std::__cxx11::regex_traits<char>_>::basic_regex
              (&parse(std::__cxx11::string_const&,metaf::ReportPart,metaf::ReportMetadata_const&)::
                windRgx_abi_cxx11_,
               "(?:WS(\\d\\d\\d)/)?(\\d\\d0|VRB|///)([1-9]?\\d\\d|//)(?:G([1-9]?\\d\\d))?([KM][TMP][HS]?)"
               ,0x10);
    __cxa_atexit(std::__cxx11::basic_regex<char,_std::__cxx11::regex_traits<char>_>::~basic_regex,
                 &parse(std::__cxx11::string_const&,metaf::ReportPart,metaf::ReportMetadata_const&)
                  ::windRgx_abi_cxx11_,&__dso_handle);
    __cxa_guard_release(&parse(std::__cxx11::string_const&,metaf::ReportPart,metaf::ReportMetadata_const&)
                         ::windRgx_abi_cxx11_);
  }
  local_e8._19_4_ = 0;
  local_e8._M_value.wSpeed.speedUnit._3_1_ = 0;
  local_e8._M_value.gSpeed.speedValue.super__Optional_base<unsigned_int,_true,_true>._M_payload.
  super__Optional_payload_base<unsigned_int> =
       (optional<unsigned_int>)(_Optional_base<unsigned_int,_true,_true>)0x0;
  local_e8._M_value.windType._0_3_ = 0;
  local_e8._3_5_ = 0;
  local_e8._M_value.windDir.dirType._0_3_ = 0;
  local_e8._11_4_ = 0;
  local_e8._15_4_ = 0;
  __s._M_current = (group->_M_dataplus)._M_p;
  bVar8 = std::__detail::
          __regex_algo_impl<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>,std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>>>,char,std::__cxx11::regex_traits<char>,(std::__detail::_RegexExecutorPolicy)0,true>
                    (__s,(__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                          )(__s._M_current + group->_M_string_length),
                     (match_results<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                      *)&local_e8._M_value,
                     &parse(std::__cxx11::string_const&,metaf::ReportPart,metaf::ReportMetadata_const&)
                      ::windRgx_abi_cxx11_,0);
  if (bVar8) {
    std::__cxx11::
    match_results<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
    ::str(&local_128,
          (match_results<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
           *)&local_e8._M_value,5);
    iVar9 = std::__cxx11::string::compare((char *)&local_128);
    bVar19 = true;
    if (iVar9 == 0) {
      uVar17 = 0;
    }
    else {
      iVar9 = std::__cxx11::string::compare((char *)&local_128);
      if (iVar9 == 0) {
        uVar17 = 1;
      }
      else {
        iVar9 = std::__cxx11::string::compare((char *)&local_128);
        bVar19 = iVar9 == 0;
        uVar17 = 2;
      }
    }
    paVar1 = &local_128.field_2;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_128._M_dataplus._M_p != paVar1) {
      operator_delete(local_128._M_dataplus._M_p,local_128.field_2._M_allocated_capacity + 1);
    }
    if (bVar19) {
      std::__cxx11::
      match_results<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
      ::str(&local_128,
            (match_results<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
             *)&local_e8._M_value,3);
      uVar10 = 0x100000000;
      if (local_128._M_string_length == 0) {
LAB_001ae082:
        iVar11 = 0;
        local_154 = 0;
      }
      else {
        iVar9 = std::__cxx11::string::compare((char *)&local_128);
        if (iVar9 == 0) {
          uVar10 = 0x100000000;
          goto LAB_001ae082;
        }
        if ((local_128._M_string_length != 2) &&
           ((local_128._M_string_length != 3 || (*local_128._M_dataplus._M_p == '0')))) {
LAB_001ae07d:
          uVar10 = 0;
          goto LAB_001ae082;
        }
        iVar11 = 0;
        uVar10 = 0;
        iVar9 = 0;
        do {
          if ((byte)(local_128._M_dataplus._M_p[uVar10] - 0x3aU) < 0xf6) {
            bVar19 = false;
            goto LAB_001ae06f;
          }
          iVar9 = (uint)(byte)(local_128._M_dataplus._M_p[uVar10] - 0x30) + iVar9 * 10;
          uVar10 = uVar10 + 1;
        } while ((uVar10 & 0xffffffff) < local_128._M_string_length);
        bVar19 = true;
        iVar11 = iVar9;
LAB_001ae06f:
        if (!bVar19) goto LAB_001ae07d;
        uVar10 = uVar17 | 0x100000000;
        local_154 = 1;
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_128._M_dataplus._M_p != paVar1) {
        operator_delete(local_128._M_dataplus._M_p,local_128.field_2._M_allocated_capacity + 1);
      }
      if ((uVar10 & 0x100000000) != 0) {
        local_100 = local_100 & 0xffffff;
        uStack_fc = 0;
        uStack_f8 = 0;
        uStack_f5 = 0;
        uStack_f1 = 0;
        TStack_ed = NOT_REPORTED;
        lVar13 = CONCAT53(local_e8._3_5_,local_e8._M_value.windType._0_3_);
        lVar5 = CONCAT17(local_e8._15_1_,
                         CONCAT43(local_e8._11_4_,local_e8._M_value.windDir.dirType._0_3_));
        if (lVar13 == lVar5) {
          bVar19 = false;
        }
        else {
          bVar19 = (lVar5 - lVar13 >> 3) * -0x5555555555555555 - 5U < 0xfffffffffffffffe;
        }
        plVar14 = (long *)(lVar13 + 0x18);
        if (!bVar19) {
          plVar14 = (long *)(lVar5 + -0x48);
        }
        local_130 = CONCAT44(local_130._4_4_,(int)uVar17);
        local_108 = uVar10;
        if (((char)plVar14[2] == '\x01') && (plVar14[1] != *plVar14)) {
LAB_001ae1c9:
          bVar19 = false;
LAB_001ae1cc:
          bVar6 = false;
          bVar20 = false;
        }
        else {
          if (lVar13 == lVar5) {
            bVar19 = false;
          }
          else {
            bVar19 = (lVar5 - lVar13 >> 3) * -0x5555555555555555 - 8U < 0xfffffffffffffffb;
          }
          plVar14 = (long *)(lVar5 + -0x48);
          if (bVar19) {
            plVar14 = (long *)(lVar13 + 0x60);
          }
          if (((char)plVar14[2] == '\x01') && (plVar14[1] != *plVar14)) goto LAB_001ae1c9;
          std::__cxx11::
          match_results<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
          ::str(&local_128,
                (match_results<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                 *)&local_e8._M_value,2);
          iVar9 = std::__cxx11::string::compare((char *)&local_128);
          if (iVar9 != 0) {
            bVar19 = true;
            goto LAB_001ae1cc;
          }
          std::__cxx11::
          match_results<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
          ::str(&local_50,
                (match_results<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                 *)&local_e8._M_value,3);
          iVar9 = std::__cxx11::string::compare((char *)&local_50);
          bVar20 = iVar9 == 0;
          bVar19 = true;
          bVar6 = true;
        }
        if ((bVar6) &&
           ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_50._M_dataplus._M_p != &local_50.field_2)) {
          operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
        }
        if ((bVar19) &&
           ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_128._M_dataplus._M_p != paVar1)) {
          operator_delete(local_128._M_dataplus._M_p,local_128.field_2._M_allocated_capacity + 1);
        }
        if (bVar20) {
          (__return_storage_ptr__->super__Optional_base<metaf::WindGroup,_true,_true>)._M_payload.
          super__Optional_payload_base<metaf::WindGroup>._M_payload._M_value.windType =
               SURFACE_WIND_CALM;
          p_Var7 = &(__return_storage_ptr__->super__Optional_base<metaf::WindGroup,_true,_true>).
                    _M_payload;
          *(uint *)((long)&(p_Var7->super__Optional_payload_base<metaf::WindGroup>)._M_payload + 4)
               = 0;
          *(Type *)((long)&(p_Var7->super__Optional_payload_base<metaf::WindGroup>)._M_payload + 8)
               = NOT_REPORTED;
          *(int *)&(__return_storage_ptr__->super__Optional_base<metaf::WindGroup,_true,_true>).
                   _M_payload.super__Optional_payload_base<metaf::WindGroup>._M_payload._M_value.
                   wSpeed.speedValue.super__Optional_base<unsigned_int,_true,_true>._M_payload =
               iVar11;
          *(undefined1 *)
           ((long)&(__return_storage_ptr__->super__Optional_base<metaf::WindGroup,_true,_true>).
                   _M_payload.super__Optional_payload_base<metaf::WindGroup>._M_payload + 0x10) =
               local_154;
          *(undefined1 *)
           ((long)&(__return_storage_ptr__->super__Optional_base<metaf::WindGroup,_true,_true>).
                   _M_payload.super__Optional_payload_base<metaf::WindGroup>._M_payload + 0x13) = 0;
          *(undefined2 *)
           ((long)&(__return_storage_ptr__->super__Optional_base<metaf::WindGroup,_true,_true>).
                   _M_payload.super__Optional_payload_base<metaf::WindGroup>._M_payload + 0x11) = 0;
          (__return_storage_ptr__->super__Optional_base<metaf::WindGroup,_true,_true>)._M_payload.
          super__Optional_payload_base<metaf::WindGroup>._M_payload._M_value.wSpeed.speedUnit =
               (Unit)local_108;
          *(undefined1 *)
           ((long)&(__return_storage_ptr__->super__Optional_base<metaf::WindGroup,_true,_true>).
                   _M_payload.super__Optional_payload_base<metaf::WindGroup>._M_payload + 0x2c) = 0;
          (__return_storage_ptr__->super__Optional_base<metaf::WindGroup,_true,_true>)._M_payload.
          super__Optional_payload_base<metaf::WindGroup>._M_payload._M_value.gSpeed.speedValue.
          super__Optional_base<unsigned_int,_true,_true>._M_payload =
               (_Optional_payload<unsigned_int,_true,_true,_true>)0x0;
          *(undefined8 *)
           &(__return_storage_ptr__->super__Optional_base<metaf::WindGroup,_true,_true>)._M_payload.
            super__Optional_payload_base<metaf::WindGroup>._M_payload._M_value.gSpeed.speedUnit = 0;
          *(ulong *)((long)&(__return_storage_ptr__->
                            super__Optional_base<metaf::WindGroup,_true,_true>)._M_payload.
                            super__Optional_payload_base<metaf::WindGroup>._M_payload + 0x2d) =
               CONCAT44(uStack_fc,local_100);
          *(ulong *)((long)&(__return_storage_ptr__->
                            super__Optional_base<metaf::WindGroup,_true,_true>)._M_payload.
                            super__Optional_payload_base<metaf::WindGroup>._M_payload._M_value.
                            vsecBegin.dirDegrees + 1) =
               CONCAT17((undefined1)uStack_f1,CONCAT43(uStack_f5,uStack_f8));
          DVar2.dirType = TStack_ed;
          DVar2.dirDegrees = uStack_f1;
          (__return_storage_ptr__->super__Optional_base<metaf::WindGroup,_true,_true>)._M_payload.
          super__Optional_payload_base<metaf::WindGroup>._M_payload._M_value.vsecEnd = DVar2;
          *(undefined1 *)
           ((long)&(__return_storage_ptr__->super__Optional_base<metaf::WindGroup,_true,_true>).
                   _M_payload.super__Optional_payload_base<metaf::WindGroup>._M_payload + 0x54) = 0;
          *(undefined1 *)
           ((long)&(__return_storage_ptr__->super__Optional_base<metaf::WindGroup,_true,_true>).
                   _M_payload.super__Optional_payload_base<metaf::WindGroup>._M_payload + 0x60) = 0;
        }
        else {
          std::__cxx11::
          match_results<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
          ::str(&local_150,
                (match_results<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                 *)&local_e8._M_value,2);
          oVar24 = Direction::fromDegreesString(&local_150);
          unit = (Unit)local_130;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_150._M_dataplus._M_p != &local_150.field_2) {
            operator_delete(local_150._M_dataplus._M_p,local_150.field_2._M_allocated_capacity + 1);
          }
          if (((undefined1  [12])
               oVar24.super__Optional_base<metaf::Direction,_true,_true>._M_payload.
               super__Optional_payload_base<metaf::Direction> & (undefined1  [12])0x1) ==
              (undefined1  [12])0x0) goto LAB_001ae0b6;
          std::__cxx11::
          match_results<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
          ::str(&local_150,
                (match_results<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                 *)&local_e8._M_value,4);
          oVar25 = Speed::fromString(&local_150,unit);
          uVar17 = oVar25.super__Optional_base<metaf::Speed,_true,_true>._M_payload.
                   super__Optional_payload_base<metaf::Speed>._M_payload._0_8_;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_150._M_dataplus._M_p != &local_150.field_2) {
            operator_delete(local_150._M_dataplus._M_p,local_150.field_2._M_allocated_capacity + 1);
          }
          if (((undefined1  [16])
               oVar25.super__Optional_base<metaf::Speed,_true,_true>._M_payload.
               super__Optional_payload_base<metaf::Speed> & (undefined1  [16])0x100000000) ==
              (undefined1  [16])0x0) {
            uVar17 = 0;
            local_130 = 0;
            uVar10 = 0;
            uVar18 = 0;
          }
          else {
            uVar18 = uVar17 & 0xffffff0000000000;
            uVar10 = uVar17 & 0xff00000000;
            uVar17 = uVar17 & 0xffffffff;
            local_130 = oVar25.super__Optional_base<metaf::Speed,_true,_true>._M_payload.
                        super__Optional_payload_base<metaf::Speed>._8_8_;
          }
          local_58 = oVar24.super__Optional_base<metaf::Direction,_true,_true>._M_payload.
                     super__Optional_payload_base<metaf::Direction>._M_payload;
          std::__cxx11::
          match_results<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
          ::str(&local_150,
                (match_results<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                 *)&local_e8._M_value,1);
          Distance::fromHeightString(&local_70,&local_150);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_150._M_dataplus._M_p != &local_150.field_2) {
            operator_delete(local_150._M_dataplus._M_p,local_150.field_2._M_allocated_capacity + 1);
          }
          if (local_70.super__Optional_base<metaf::Distance,_true,_true>._M_payload.
              super__Optional_payload_base<metaf::Distance>._M_engaged == true) {
            uVar22 = (undefined4)
                     local_70.super__Optional_base<metaf::Distance,_true,_true>._M_payload.
                     super__Optional_payload_base<metaf::Distance>._M_payload._0_8_;
            uVar23 = (undefined4)
                     ((ulong)local_70.super__Optional_base<metaf::Distance,_true,_true>._M_payload.
                             super__Optional_payload_base<metaf::Distance>._M_payload._0_8_ >> 0x20)
            ;
            local_100 = local_70.super__Optional_base<metaf::Distance,_true,_true>._M_payload.
                        super__Optional_payload_base<metaf::Distance>._M_payload._9_4_;
            uStack_fc = CONCAT13(uStack_fc._3_1_,
                                 local_70.super__Optional_base<metaf::Distance,_true,_true>.
                                 _M_payload.super__Optional_payload_base<metaf::Distance>._M_payload
                                 ._M_value.distUnit._1_3_);
            TVar12 = WIND_SHEAR;
          }
          else {
            uVar22 = 0;
            uVar23 = 0;
            local_70.super__Optional_base<metaf::Distance,_true,_true>._M_payload.
            super__Optional_payload_base<metaf::Distance>._M_payload._M_value.dist.
            super__Optional_base<unsigned_int,_true,_true>._M_payload.
            super__Optional_payload_base<unsigned_int>._M_engaged = (bool)0;
            TVar12 = SURFACE_WIND;
          }
          (__return_storage_ptr__->super__Optional_base<metaf::WindGroup,_true,_true>)._M_payload.
          super__Optional_payload_base<metaf::WindGroup>._M_payload._M_value.windType = TVar12;
          (__return_storage_ptr__->super__Optional_base<metaf::WindGroup,_true,_true>)._M_payload.
          super__Optional_payload_base<metaf::WindGroup>._M_payload._M_value.windDir =
               (Direction)local_58;
          *(int *)&(__return_storage_ptr__->super__Optional_base<metaf::WindGroup,_true,_true>).
                   _M_payload.super__Optional_payload_base<metaf::WindGroup>._M_payload._M_value.
                   wSpeed.speedValue.super__Optional_base<unsigned_int,_true,_true>._M_payload =
               iVar11;
          *(undefined1 *)
           ((long)&(__return_storage_ptr__->super__Optional_base<metaf::WindGroup,_true,_true>).
                   _M_payload.super__Optional_payload_base<metaf::WindGroup>._M_payload + 0x10) =
               local_154;
          *(undefined1 *)
           ((long)&(__return_storage_ptr__->super__Optional_base<metaf::WindGroup,_true,_true>).
                   _M_payload.super__Optional_payload_base<metaf::WindGroup>._M_payload + 0x13) = 0;
          *(undefined2 *)
           ((long)&(__return_storage_ptr__->super__Optional_base<metaf::WindGroup,_true,_true>).
                   _M_payload.super__Optional_payload_base<metaf::WindGroup>._M_payload + 0x11) = 0;
          (__return_storage_ptr__->super__Optional_base<metaf::WindGroup,_true,_true>)._M_payload.
          super__Optional_payload_base<metaf::WindGroup>._M_payload._M_value.wSpeed.speedUnit =
               (Unit)local_108;
          (__return_storage_ptr__->super__Optional_base<metaf::WindGroup,_true,_true>)._M_payload.
          super__Optional_payload_base<metaf::WindGroup>._M_payload._M_value.gSpeed.speedValue.
          super__Optional_base<unsigned_int,_true,_true>._M_payload =
               (_Optional_payload<unsigned_int,_true,_true,_true>)(uVar10 | uVar17 | uVar18);
          (__return_storage_ptr__->super__Optional_base<metaf::WindGroup,_true,_true>)._M_payload.
          super__Optional_payload_base<metaf::WindGroup>._M_payload._M_value.gSpeed.speedUnit =
               (Unit)local_130;
          *(ulong *)((long)&(__return_storage_ptr__->
                            super__Optional_base<metaf::WindGroup,_true,_true>)._M_payload.
                            super__Optional_payload_base<metaf::WindGroup>._M_payload + 0x24) =
               CONCAT44(uVar23,uVar22);
          *(undefined1 *)
           ((long)&(__return_storage_ptr__->super__Optional_base<metaf::WindGroup,_true,_true>).
                   _M_payload.super__Optional_payload_base<metaf::WindGroup>._M_payload + 0x2c) =
               local_70.super__Optional_base<metaf::Distance,_true,_true>._M_payload.
               super__Optional_payload_base<metaf::Distance>._M_payload._M_value.dist.
               super__Optional_base<unsigned_int,_true,_true>._M_payload.
               super__Optional_payload_base<unsigned_int>._M_engaged;
          *(ulong *)((long)&(__return_storage_ptr__->
                            super__Optional_base<metaf::WindGroup,_true,_true>)._M_payload.
                            super__Optional_payload_base<metaf::WindGroup>._M_payload + 0x2d) =
               CONCAT44(uStack_fc,local_100);
          *(ulong *)((long)&(__return_storage_ptr__->
                            super__Optional_base<metaf::WindGroup,_true,_true>)._M_payload.
                            super__Optional_payload_base<metaf::WindGroup>._M_payload._M_value.
                            vsecBegin.dirDegrees + 1) =
               CONCAT17((undefined1)uStack_f1,CONCAT43(uStack_f5,uStack_f8));
          DVar3.dirType = TStack_ed;
          DVar3.dirDegrees = uStack_f1;
          (__return_storage_ptr__->super__Optional_base<metaf::WindGroup,_true,_true>)._M_payload.
          super__Optional_payload_base<metaf::WindGroup>._M_payload._M_value.vsecEnd = DVar3;
          *(undefined1 *)
           ((long)&(__return_storage_ptr__->super__Optional_base<metaf::WindGroup,_true,_true>).
                   _M_payload.super__Optional_payload_base<metaf::WindGroup>._M_payload + 0x54) = 0;
          *(undefined1 *)
           ((long)&(__return_storage_ptr__->super__Optional_base<metaf::WindGroup,_true,_true>).
                   _M_payload.super__Optional_payload_base<metaf::WindGroup>._M_payload + 0x60) = 0;
        }
        (__return_storage_ptr__->super__Optional_base<metaf::WindGroup,_true,_true>)._M_payload.
        super__Optional_payload_base<metaf::WindGroup>._M_payload._M_value.incompleteText = NONE;
        (__return_storage_ptr__->super__Optional_base<metaf::WindGroup,_true,_true>)._M_payload.
        super__Optional_payload_base<metaf::WindGroup>._M_engaged = true;
        goto LAB_001ae0d4;
      }
    }
LAB_001ae0b6:
    *(undefined8 *)
     ((long)&(__return_storage_ptr__->super__Optional_base<metaf::WindGroup,_true,_true>)._M_payload
             .super__Optional_payload_base<metaf::WindGroup>._M_payload._M_value.rw.
             super__Optional_base<metaf::Runway,_true,_true>._M_payload + 4) = 0;
    *(undefined8 *)
     ((long)&(__return_storage_ptr__->super__Optional_base<metaf::WindGroup,_true,_true>)._M_payload
             .super__Optional_payload_base<metaf::WindGroup>._M_payload + 100) = 0;
    *(undefined8 *)
     ((long)&(__return_storage_ptr__->super__Optional_base<metaf::WindGroup,_true,_true>)._M_payload
             .super__Optional_payload_base<metaf::WindGroup>._M_payload + 0x50) = 0;
    (__return_storage_ptr__->super__Optional_base<metaf::WindGroup,_true,_true>)._M_payload.
    super__Optional_payload_base<metaf::WindGroup>._M_payload._M_value.rw.
    super__Optional_base<metaf::Runway,_true,_true>._M_payload.
    super__Optional_payload_base<metaf::Runway>._M_payload = 0;
    *(undefined8 *)
     &(__return_storage_ptr__->super__Optional_base<metaf::WindGroup,_true,_true>)._M_payload.
      super__Optional_payload_base<metaf::WindGroup>._M_payload._M_value.vsecEnd.dirType = 0;
    *(undefined8 *)
     ((long)&(__return_storage_ptr__->super__Optional_base<metaf::WindGroup,_true,_true>)._M_payload
             .super__Optional_payload_base<metaf::WindGroup>._M_payload + 0x48) = 0;
    *(undefined8 *)
     ((long)&(__return_storage_ptr__->super__Optional_base<metaf::WindGroup,_true,_true>)._M_payload
             .super__Optional_payload_base<metaf::WindGroup>._M_payload + 0x30) = 0;
    *(undefined8 *)
     &(__return_storage_ptr__->super__Optional_base<metaf::WindGroup,_true,_true>)._M_payload.
      super__Optional_payload_base<metaf::WindGroup>._M_payload._M_value.vsecBegin.dirType = 0;
    *(undefined8 *)
     &(__return_storage_ptr__->super__Optional_base<metaf::WindGroup,_true,_true>)._M_payload.
      super__Optional_payload_base<metaf::WindGroup>._M_payload._M_value.gSpeed.speedUnit = 0;
    *(undefined8 *)
     ((long)&(__return_storage_ptr__->super__Optional_base<metaf::WindGroup,_true,_true>)._M_payload
             .super__Optional_payload_base<metaf::WindGroup>._M_payload + 0x28) = 0;
    *(undefined8 *)
     ((long)&(__return_storage_ptr__->super__Optional_base<metaf::WindGroup,_true,_true>)._M_payload
             .super__Optional_payload_base<metaf::WindGroup>._M_payload._M_value.wSpeed.speedValue.
             super__Optional_base<unsigned_int,_true,_true> + 4) = 0;
    (__return_storage_ptr__->super__Optional_base<metaf::WindGroup,_true,_true>)._M_payload.
    super__Optional_payload_base<metaf::WindGroup>._M_payload._M_value.gSpeed.speedValue.
    super__Optional_base<unsigned_int,_true,_true>._M_payload =
         (_Optional_payload<unsigned_int,_true,_true,_true>)0x0;
    *(undefined8 *)
     &(__return_storage_ptr__->super__Optional_base<metaf::WindGroup,_true,_true>)._M_payload.
      super__Optional_payload_base<metaf::WindGroup>._M_payload = 0;
    *(undefined8 *)
     &(__return_storage_ptr__->super__Optional_base<metaf::WindGroup,_true,_true>)._M_payload.
      super__Optional_payload_base<metaf::WindGroup>._M_payload._M_value.windDir.dirType = 0;
  }
LAB_001ae0d4:
  pvVar4 = (void *)CONCAT53(local_e8._3_5_,local_e8._M_value.windType._0_3_);
  if (pvVar4 != (void *)0x0) {
    operator_delete(pvVar4,CONCAT17(local_e8._M_value.wSpeed.speedUnit._3_1_,
                                    CONCAT43(local_e8._19_4_,local_e8._16_3_)) - (long)pvVar4);
  }
  if (bVar8) {
    return __return_storage_ptr__;
  }
LAB_001add00:
  *(undefined8 *)
   ((long)&(__return_storage_ptr__->super__Optional_base<metaf::WindGroup,_true,_true>)._M_payload.
           super__Optional_payload_base<metaf::WindGroup>._M_payload._M_value.rw.
           super__Optional_base<metaf::Runway,_true,_true>._M_payload + 4) = 0;
  *(undefined8 *)
   ((long)&(__return_storage_ptr__->super__Optional_base<metaf::WindGroup,_true,_true>)._M_payload.
           super__Optional_payload_base<metaf::WindGroup>._M_payload + 100) = 0;
  *(undefined8 *)
   ((long)&(__return_storage_ptr__->super__Optional_base<metaf::WindGroup,_true,_true>)._M_payload.
           super__Optional_payload_base<metaf::WindGroup>._M_payload + 0x50) = 0;
  (__return_storage_ptr__->super__Optional_base<metaf::WindGroup,_true,_true>)._M_payload.
  super__Optional_payload_base<metaf::WindGroup>._M_payload._M_value.rw.
  super__Optional_base<metaf::Runway,_true,_true>._M_payload.
  super__Optional_payload_base<metaf::Runway>._M_payload = 0;
  *(undefined8 *)
   &(__return_storage_ptr__->super__Optional_base<metaf::WindGroup,_true,_true>)._M_payload.
    super__Optional_payload_base<metaf::WindGroup>._M_payload._M_value.vsecEnd.dirType = 0;
  *(undefined8 *)
   ((long)&(__return_storage_ptr__->super__Optional_base<metaf::WindGroup,_true,_true>)._M_payload.
           super__Optional_payload_base<metaf::WindGroup>._M_payload + 0x48) = 0;
  *(undefined8 *)
   ((long)&(__return_storage_ptr__->super__Optional_base<metaf::WindGroup,_true,_true>)._M_payload.
           super__Optional_payload_base<metaf::WindGroup>._M_payload + 0x30) = 0;
  *(undefined8 *)
   &(__return_storage_ptr__->super__Optional_base<metaf::WindGroup,_true,_true>)._M_payload.
    super__Optional_payload_base<metaf::WindGroup>._M_payload._M_value.vsecBegin.dirType = 0;
  *(undefined8 *)
   &(__return_storage_ptr__->super__Optional_base<metaf::WindGroup,_true,_true>)._M_payload.
    super__Optional_payload_base<metaf::WindGroup>._M_payload._M_value.gSpeed.speedUnit = 0;
  *(undefined8 *)
   ((long)&(__return_storage_ptr__->super__Optional_base<metaf::WindGroup,_true,_true>)._M_payload.
           super__Optional_payload_base<metaf::WindGroup>._M_payload + 0x28) = 0;
  *(undefined8 *)
   ((long)&(__return_storage_ptr__->super__Optional_base<metaf::WindGroup,_true,_true>)._M_payload.
           super__Optional_payload_base<metaf::WindGroup>._M_payload._M_value.wSpeed.speedValue.
           super__Optional_base<unsigned_int,_true,_true> + 4) = 0;
  (__return_storage_ptr__->super__Optional_base<metaf::WindGroup,_true,_true>)._M_payload.
  super__Optional_payload_base<metaf::WindGroup>._M_payload._M_value.gSpeed.speedValue.
  super__Optional_base<unsigned_int,_true,_true>._M_payload =
       (_Optional_payload<unsigned_int,_true,_true,_true>)0x0;
  *(undefined8 *)
   &(__return_storage_ptr__->super__Optional_base<metaf::WindGroup,_true,_true>)._M_payload.
    super__Optional_payload_base<metaf::WindGroup>._M_payload = 0;
  *(undefined8 *)
   &(__return_storage_ptr__->super__Optional_base<metaf::WindGroup,_true,_true>)._M_payload.
    super__Optional_payload_base<metaf::WindGroup>._M_payload._M_value.windDir.dirType = 0;
  return __return_storage_ptr__;
}

Assistant:

std::optional<WindGroup> WindGroup::parse(const std::string & group,
		ReportPart reportPart,
		const ReportMetadata & reportMetadata)
{
	(void)reportMetadata;
	static const std::optional<WindGroup> notRecognised;

	if (reportPart == ReportPart::METAR) {
		if (group == "WS") return WindGroup(Type::WIND_SHEAR_IN_LOWER_LAYERS, IncompleteText::WS);
	}
	if (reportPart == ReportPart::TAF) {
		if (group == "WSCONDS") return WindGroup(Type::WSCONDS);
	}
	if (reportPart == ReportPart::RMK) {
		if (group == "WSHFT") return WindGroup(Type::WIND_SHIFT);
		if (group == "PK") return WindGroup(Type::PEAK_WIND, IncompleteText::PK);
		if (group == "WND") return WindGroup(Type::WND_MISG, IncompleteText::WND);
	}

	if (reportPart != ReportPart::METAR &&
		reportPart != ReportPart::TAF) return notRecognised;

	if (const auto result = parseVariableSector(group); result.has_value())
		return *result;

	static const std::regex windRgx("(?:WS(\\d\\d\\d)/)?"
		"(\\d\\d0|VRB|///)([1-9]?\\d\\d|//)(?:G([1-9]?\\d\\d))?([KM][TMP][HS]?)");
	static const auto matchWindShearHeight = 1, matchWindDir = 2;
	static const auto matchWindSpeed = 3, matchWindGust = 4, matchWindUnit = 5;

	// Surface wind or wind shear, e.g. dd0ssKT or dd0ssGggMPS or WShhhdd0ssGggKT
	if (std::smatch match; std::regex_match(group, match, windRgx)) {
		const auto speedUnit = Speed::unitFromString(match.str(matchWindUnit));
		if (!speedUnit.has_value()) return notRecognised;
		const auto speed = Speed::fromString(match.str(matchWindSpeed), *speedUnit);
		if (!speed.has_value()) return notRecognised;

		WindGroup result;

		if (!match.length(matchWindShearHeight) && 
			!match.length(matchWindGust) &&
			match.str(matchWindDir) == "000" &&
			match.str(matchWindSpeed) == "00")
		{
			//00000KT or 00000MPS or 00000KMH: calm wind
			result.windType = Type::SURFACE_WIND_CALM;
			result.wSpeed = *speed;
			return result;
		}

		const auto dir = Direction::fromDegreesString(match.str(matchWindDir));
		if (!dir.has_value()) return notRecognised;
		result.windDir = *dir;
		result.wSpeed = *speed;
		const auto gust = Speed::fromString(match.str(matchWindGust), *speedUnit);
		if (gust.has_value()) result.gSpeed = *gust;
		const auto wsHeight = Distance::fromHeightString(match.str(matchWindShearHeight));
		result.windType = Type::SURFACE_WIND;
		if (wsHeight.has_value()) {
			result.windType = Type::WIND_SHEAR;
			result.wShHeight = *wsHeight;
		}
		return result;
	}

	return notRecognised;
}